

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O0

void * __thiscall cppcms::impl::buddy_allocator::malloc(buddy_allocator *this,size_t __size)

{
  size_t n_00;
  page *ppVar1;
  void *r;
  page *p;
  int bits;
  size_t n;
  page **local_8;
  
  n_00 = ((__size + 0xf >> 4) + 1) * 0x10;
  get_bits(n_00);
  ppVar1 = page_alloc((buddy_allocator *)__size,(int)(n_00 >> 0x20));
  if (ppVar1 == (page *)0x0) {
    local_8 = (page **)0x0;
  }
  else {
    local_8 = &ppVar1->prev;
  }
  return local_8;
}

Assistant:

void *malloc(size_t required_size)
	{
		size_t n = ((required_size+alignment-1)/alignment + 1)*alignment;
		int bits = get_bits(n);

		
		LOG("Allocating chunk of size %zd (%d) for request of %zd",n,bits,required_size);
		page *p = page_alloc(bits);
		LOG("Got %zx",(p?(char*)(p) - memory():0));
		if(!p)
			return 0;
		void *r = reinterpret_cast<char *>(p) + alignment;
		return r;
	}